

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::TcpSocket::SetBufsizeIn(TcpSocket *this,uint s)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = 0x200;
  if (0x200 < s) {
    uVar2 = s;
  }
  if (uVar2 != this->_inbufSize) {
    pcVar1 = (char *)realloc(this->_inbuf,(ulong)uVar2);
    this->_inbuf = pcVar1;
  }
  this->_inbufSize = uVar2;
  this->_writeSize = uVar2 - 1;
  this->_writeptr = this->_inbuf;
  this->_readptr = this->_inbuf;
  return;
}

Assistant:

void TcpSocket::SetBufsizeIn(unsigned int s)
{
    if(s < 512)
        s = 512;
    if(s != _inbufSize)
        _inbuf = (char*)realloc(_inbuf, s);
    _inbufSize = s;
    _writeSize = s - 1;
    _readptr = _writeptr = _inbuf;
}